

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O1

void __thiscall
duckdb::ArrayColumnData::Append
          (ArrayColumnData *this,BaseStatistics *stats,ColumnAppendState *state,Vector *vector,
          idx_t count)

{
  atomic<unsigned_long> *paVar1;
  reference pvVar2;
  idx_t iVar3;
  Vector *pVVar4;
  pointer pCVar5;
  BaseStatistics *pBVar6;
  Vector append_vector;
  Vector local_98;
  
  if (vector->vector_type == FLAT_VECTOR) {
    pvVar2 = vector<duckdb::ColumnAppendState,_true>::operator[](&state->child_appends,0);
    ColumnData::Append(&(this->validity).super_ColumnData,stats,pvVar2,vector,count);
    iVar3 = ArrayType::GetSize(&(this->super_ColumnData).type);
    pVVar4 = ArrayVector::GetEntry(vector);
    pCVar5 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->(&this->child_column);
    pBVar6 = ArrayStats::GetChildStats(stats);
    pvVar2 = vector<duckdb::ColumnAppendState,_true>::operator[](&state->child_appends,1);
    (*pCVar5->_vptr_ColumnData[0x12])(pCVar5,pBVar6,pvVar2,pVVar4,iVar3 * count);
    LOCK();
    paVar1 = &(this->super_ColumnData).count;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
    UNLOCK();
  }
  else {
    Vector::Vector(&local_98,vector);
    Vector::Flatten(&local_98,count);
    (*(this->super_ColumnData)._vptr_ColumnData[0x12])(this,stats,state,&local_98,count);
    if (local_98.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_98.type);
  }
  return;
}

Assistant:

void ArrayColumnData::Append(BaseStatistics &stats, ColumnAppendState &state, Vector &vector, idx_t count) {
	if (vector.GetVectorType() != VectorType::FLAT_VECTOR) {
		Vector append_vector(vector);
		append_vector.Flatten(count);
		Append(stats, state, append_vector, count);
		return;
	}

	// Append validity
	validity.Append(stats, state.child_appends[0], vector, count);
	// Append child column
	auto array_size = ArrayType::GetSize(type);
	auto &child_vec = ArrayVector::GetEntry(vector);
	child_column->Append(ArrayStats::GetChildStats(stats), state.child_appends[1], child_vec, count * array_size);

	this->count += count;
}